

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

int lyds_compare_single(lyd_node *node1,lyd_node *node2)

{
  ly_bool lVar1;
  lyd_node *node2_local;
  lyd_node *node1_local;
  
  if (((node1 != (lyd_node *)0x0) && (node2 != (lyd_node *)0x0)) && (node1->schema == node2->schema)
     ) {
    lVar1 = lyds_is_supported(node1);
    if (lVar1 != '\0') {
      if (node1 == node2) {
        node1_local._4_4_ = 0;
      }
      else if (node1->schema->nodetype == 8) {
        node1_local._4_4_ = rb_compare_leaflists(node1,node2);
      }
      else {
        node1_local._4_4_ = rb_compare_lists(node1,node2);
      }
      return node1_local._4_4_;
    }
  }
  __assert_fail("node1 && node2 && (node1->schema == node2->schema) && lyds_is_supported(node1)",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                ,0x6c5,"int lyds_compare_single(struct lyd_node *, struct lyd_node *)");
}

Assistant:

int
lyds_compare_single(struct lyd_node *node1, struct lyd_node *node2)
{
    assert(node1 && node2 && (node1->schema == node2->schema) && lyds_is_supported(node1));

    if (node1 == node2) {
        return 0;
    } else if (node1->schema->nodetype == LYS_LEAFLIST) {
        return rb_compare_leaflists(node1, node2);
    } else {
        return rb_compare_lists(node1, node2);
    }
}